

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O0

X509V3_EXT_METHOD * X509V3_EXT_get_nid(int nid)

{
  int iVar1;
  size_t local_98;
  size_t idx;
  X509V3_EXT_METHOD **ret;
  X509V3_EXT_METHOD *t;
  X509V3_EXT_METHOD tmp;
  X509V3_EXT_METHOD *pXStack_10;
  int nid_local;
  
  ret = &t;
  if (nid < 0) {
    pXStack_10 = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    t._0_4_ = nid;
    tmp.usr_data._4_4_ = nid;
    idx = (size_t)bsearch(&ret,standard_exts,0x1f,8,ext_cmp);
    if ((undefined8 *)idx == (undefined8 *)0x0) {
      if (ext_list == (stack_st_X509V3_EXT_METHOD *)0x0) {
        pXStack_10 = (X509V3_EXT_METHOD *)0x0;
      }
      else {
        iVar1 = sk_X509V3_EXT_METHOD_find(ext_list,&local_98,(X509V3_EXT_METHOD *)&t);
        if (iVar1 == 0) {
          pXStack_10 = (X509V3_EXT_METHOD *)0x0;
        }
        else {
          pXStack_10 = (X509V3_EXT_METHOD *)sk_X509V3_EXT_METHOD_value(ext_list,local_98);
        }
      }
    }
    else {
      pXStack_10 = *(X509V3_EXT_METHOD **)idx;
    }
  }
  return pXStack_10;
}

Assistant:

const X509V3_EXT_METHOD *X509V3_EXT_get_nid(int nid) {
  X509V3_EXT_METHOD tmp;
  const X509V3_EXT_METHOD *t = &tmp, *const * ret;
  size_t idx;

  if (nid < 0) {
    return NULL;
  }
  tmp.ext_nid = nid;
  ret = reinterpret_cast<X509V3_EXT_METHOD **>(
      bsearch(&t, standard_exts, STANDARD_EXTENSION_COUNT,
              sizeof(X509V3_EXT_METHOD *), ext_cmp));
  if (ret) {
    return *ret;
  }
  if (!ext_list) {
    return NULL;
  }

  if (!sk_X509V3_EXT_METHOD_find(ext_list, &idx, &tmp)) {
    return NULL;
  }
  return sk_X509V3_EXT_METHOD_value(ext_list, idx);
}